

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ratectrl.c
# Opt level: O0

int get_kf_active_quality(PRIMARY_RATE_CONTROL *p_rc,int q,aom_bit_depth_t bit_depth)

{
  int iVar1;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  int *kf_high_motion_minq;
  int *kf_low_motion_minq;
  int *local_20;
  int *local_18;
  
  if (in_EDX == 8) {
    local_18 = kf_low_motion_minq_8;
  }
  else if (in_EDX == 10) {
    local_18 = kf_low_motion_minq_10;
  }
  else if (in_EDX == 0xc) {
    local_18 = kf_low_motion_minq_12;
  }
  else {
    local_18 = (int *)0x0;
  }
  if (in_EDX == 8) {
    local_20 = kf_high_motion_minq_8;
  }
  else if (in_EDX == 10) {
    local_20 = kf_high_motion_minq_10;
  }
  else if (in_EDX == 0xc) {
    local_20 = kf_high_motion_minq_12;
  }
  else {
    local_20 = (int *)0x0;
  }
  iVar1 = get_active_quality(in_ESI,*(int *)(in_RDI + 8),kf_low,kf_high,local_18,local_20);
  return iVar1;
}

Assistant:

static int get_kf_active_quality(const PRIMARY_RATE_CONTROL *const p_rc, int q,
                                 aom_bit_depth_t bit_depth) {
  int *kf_low_motion_minq;
  int *kf_high_motion_minq;
  ASSIGN_MINQ_TABLE(bit_depth, kf_low_motion_minq);
  ASSIGN_MINQ_TABLE(bit_depth, kf_high_motion_minq);
  return get_active_quality(q, p_rc->kf_boost, kf_low, kf_high,
                            kf_low_motion_minq, kf_high_motion_minq);
}